

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::VariableObserverList::notify_observers(VariableObserverList *this,string *value)

{
  pointer ppVVar1;
  ulong uVar2;
  
  if (this->block_notify_ == false) {
    this->block_notify_ = true;
    ppVVar1 = (this->observers_).
              super__Vector_base<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->observers_).
        super__Vector_base<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppVVar1) {
      uVar2 = 0;
      do {
        (**ppVVar1[uVar2]->_vptr_VariableObserver)(ppVVar1[uVar2],value);
        uVar2 = uVar2 + 1;
        ppVVar1 = (this->observers_).
                  super__Vector_base<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar2 < (ulong)((long)(this->observers_).
                                     super__Vector_base<GEO::VariableObserver_*,_std::allocator<GEO::VariableObserver_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3
                              ));
    }
    this->block_notify_ = false;
  }
  return;
}

Assistant:

void VariableObserverList::notify_observers(
        const std::string& value
    ) {
        if(block_notify_) {
            return;
        }
        block_notify_ = true;
        for(size_t i = 0; i < observers_.size(); i++) {
            observers_[i]->value_changed(value);
        }
        block_notify_ = false;
    }